

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivConstantBound.cpp
# Opt level: O0

void TPZShapeHDivConstantBound<pzshape::TPZShapeTriang>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi)

{
  _func_int **pp_Var1;
  int iVar2;
  int iVar3;
  int *piVar4;
  double *pdVar5;
  long in_RSI;
  TPZFMatrix<double> *this;
  int i;
  int nEdges_1;
  TPZVec<double> qsi;
  TPZFMatrix<double> curlPhiAux;
  TPZFMatrix<double> phiAux;
  int nshape;
  int nEdges;
  int dim;
  int nsides;
  int ncorner;
  TPZShapeData *in_stack_00001208;
  TPZVec<double> *in_stack_00001210;
  TPZFMatrix<double> *in_stack_fffffffffffffe50;
  TPZVec<double> *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  int64_t row;
  int local_188;
  int64_t in_stack_fffffffffffffe80;
  int64_t in_stack_fffffffffffffe88;
  TPZFMatrix<double> *in_stack_fffffffffffffe90;
  
  pztopology::TPZTriangle::NumSides(0x18bb60a);
  TPZShapeH1<pzshape::TPZShapeTriang>::Shape(in_stack_00001210,in_stack_00001208);
  row = 0;
  piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RSI + 0x2c70),0);
  this = (TPZFMatrix<double> *)((double)*piVar4 + (double)*piVar4);
  pdVar5 = TPZFMatrix<double>::operator()
                     (this,row,CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  *pdVar5 = (double)this;
  iVar2 = TPZShapeHCurlNoGrads<pzshape::TPZShapeTriang>::NHCurlShapeF((TPZShapeData *)0x18bb67d);
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  TPZFMatrix<double>::Zero(in_stack_fffffffffffffe50);
  TPZVec<double>::TPZVec
            ((TPZVec<double> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             in_stack_fffffffffffffe58);
  TPZShapeHCurlNoGrads<pzshape::TPZShapeTriang>::Shape
            ((TPZVec<double> *)phiAux.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow,
             (TPZShapeData *)
             phiAux.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable,
             (TPZFMatrix<double> *)curlPhiAux.fWork.fNAlloc,
             (TPZFMatrix<double> *)curlPhiAux.fWork.fNElements);
  iVar3 = pztopology::TPZTriangle::NumSides(0x18bb702);
  for (local_188 = iVar3; local_188 < iVar2; local_188 = local_188 + 1) {
    pdVar5 = TPZFMatrix<double>::operator()(this,row,CONCAT44(iVar3,in_stack_fffffffffffffe60));
    pp_Var1 = (_func_int **)*pdVar5;
    in_stack_fffffffffffffe50 =
         (TPZFMatrix<double> *)
         TPZFMatrix<double>::operator()(this,row,CONCAT44(iVar3,in_stack_fffffffffffffe60));
    (in_stack_fffffffffffffe50->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable = pp_Var1;
  }
  TPZVec<double>::~TPZVec((TPZVec<double> *)in_stack_fffffffffffffe50);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x18bb7e1);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x18bb7ee);
  return;
}

Assistant:

void TPZShapeHDivConstantBound<TSHAPE>::Shape(const TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi) {

    const int ncorner = TSHAPE::NCornerNodes;
    const int nsides = TSHAPE::NSides;
    const int dim = TSHAPE::Dimension;
    const auto nEdges = TSHAPE::NumSides(1);
    TPZShapeH1<TSHAPE>::Shape(pt,data);

    if (dim == 1){
        phi(0,0) = 0.5 * data.fSideOrient[0];

        int nshape = data.fPhi.Rows();

        for (int i = 0; i < nshape-ncorner; i++){
            phi(i+1,0) = -data.fDPhi(0,i+ncorner);
        }
    } else if (dim == 2) {
        
        
        if (TSHAPE::Type() == EQuadrilateral){
            phi(0,0) = 0.25 * data.fSideOrient[0];
        } else if (TSHAPE::Type() == ETriangle){
            phi(0,0) = 2. * data.fSideOrient[0];
        }

        int nshape = TPZShapeHCurlNoGrads<TSHAPE>::NHCurlShapeF(data);

        TPZFMatrix<REAL> phiAux(2,nshape),curlPhiAux(1,nshape);
        curlPhiAux.Zero();
        auto qsi = pt;
        TPZShapeHCurlNoGrads<TSHAPE>::Shape(qsi,data,phiAux,curlPhiAux);

        auto nEdges = TSHAPE::NumSides(1); 
       
        for (int i = nEdges; i < nshape; i++)
        {
            phi(i-nEdges+1,0) = curlPhiAux(0,i);
        }
        
    } else {
        DebugStop();
    }


}